

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connector.cpp
# Opt level: O2

uint __thiscall cppcms::impl::tcp_connector::hash(tcp_connector *this,string *key)

{
  uint uVar1;
  size_type sVar2;
  
  uVar1 = 0;
  if (this->conns != 1) {
    uVar1 = 0;
    for (sVar2 = 0; key->_M_string_length != sVar2; sVar2 = sVar2 + 1) {
      uVar1 = (uVar1 << 5 | uVar1 >> 0x1b) ^ (uint)(byte)(key->_M_dataplus)._M_p[sVar2];
    }
    uVar1 = uVar1 % (uint)this->conns;
  }
  return uVar1;
}

Assistant:

unsigned tcp_connector::hash(std::string const &key)
{
	if(conns==1) return 0;
	unsigned h=0;
	// crc 
	for(size_t i=0;i<key.size();i++)  {
		unsigned char c=key[i];

		unsigned highorder = h & 0xf8000000u;
		h<<=5;
		h^=highorder >> 27;
		h^=c;
	}
	return h % conns;
}